

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

type jsoncons::jsonpointer::
     get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::__cxx11::string>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *location_str,
               bool create_if_missing,error_code *ec)

{
  bool bVar1;
  error_code *ec_00;
  error_code *in_RCX;
  undefined1 extraout_var;
  string *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  error_code *in_stack_00000030;
  basic_json_pointer<char> jsonptr;
  undefined1 create_if_missing_00;
  basic_json_pointer<char> *in_stack_ffffffffffffffc0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_8;
  
  ec_00 = (error_code *)std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  create_if_missing_00 = extraout_var;
  basic_json_pointer<char>::parse
            ((string_view_type *)
             jsonptr.tokens_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,in_stack_00000030);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  local_8 = in_RDI;
  if (!bVar1) {
    local_8 = get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         (bool)create_if_missing_00,ec_00);
  }
  basic_json_pointer<char>::~basic_json_pointer((basic_json_pointer<char> *)0x55a4d6);
  return local_8;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,Json&>::type
    get(Json& root, 
        const StringSource& location_str, 
        bool create_if_missing,
        std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return root;
        }
        return get(root, jsonptr, create_if_missing, ec);
    }